

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int update_max_streams(st_quicly_max_streams_t *m,uint64_t count)

{
  int iVar1;
  
  iVar1 = 0x20004;
  if (((count < 0x1000000000000001) && (iVar1 = 0, m->count < count)) &&
     (m->count = count, (ulong)(m->blocked_sender).max_acked < count)) {
    (m->blocked_sender).max_acked = count;
  }
  return iVar1;
}

Assistant:

static int update_max_streams(struct st_quicly_max_streams_t *m, uint64_t count)
{
    if (count > (uint64_t)1 << 60)
        return QUICLY_TRANSPORT_ERROR_STREAM_LIMIT;

    if (m->count < count) {
        m->count = count;
        if (m->blocked_sender.max_acked < count)
            m->blocked_sender.max_acked = count;
    }

    return 0;
}